

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O3

void * readwrite_routine(void *arg)

{
  byte *__s1;
  int __fd;
  int iVar1;
  in_addr_t iVar2;
  uint *puVar3;
  stCoEpoll_t *ctx;
  ssize_t sVar4;
  uint uVar5;
  in_addr_t iVar6;
  int error;
  uint32_t socklen;
  sockaddr_in addr;
  char buf [16384];
  uint local_4060;
  socklen_t local_405c;
  pollfd local_4058;
  sockaddr local_4050;
  undefined8 *local_4040;
  undefined1 local_4038 [16392];
  
  local_4040 = (undefined8 *)arg;
  co_enable_hook_sys();
  __fd = -1;
LAB_00103742:
  do {
    if (__fd < 0) {
      iVar6 = 0;
      __fd = socket(2,1,0);
      __s1 = (byte *)*local_4040;
      local_4050.sa_data[10] = '\0';
      local_4050.sa_data[0xb] = '\0';
      local_4050.sa_data[0xc] = '\0';
      local_4050.sa_data[0xd] = '\0';
      local_4050.sa_data[2] = '\0';
      local_4050.sa_data[3] = '\0';
      local_4050.sa_data[4] = '\0';
      local_4050.sa_data[5] = '\0';
      local_4050.sa_data[6] = '\0';
      local_4050.sa_data[7] = '\0';
      local_4050.sa_data[8] = '\0';
      local_4050.sa_data[9] = '\0';
      local_4050.sa_family = 2;
      local_4050.sa_data._0_2_ = *(ushort *)(local_4040 + 1) << 8 | *(ushort *)(local_4040 + 1) >> 8
      ;
      iVar2 = iVar6;
      if ((__s1 != (byte *)0x0) && (uVar5 = (uint)*__s1, iVar2 = uVar5, *__s1 != 0)) {
        if (uVar5 == 0x30) {
          iVar2 = iVar6;
          if ((__s1[1] != 0) && (iVar1 = strcmp((char *)__s1,"0.0.0.0"), iVar1 != 0)) {
LAB_001037ef:
            iVar2 = inet_addr((char *)__s1);
          }
        }
        else {
          iVar1 = strcmp((char *)__s1,"0.0.0.0");
          iVar2 = iVar6;
          if ((iVar1 != 0) && ((uVar5 != 0x2a || (iVar2 = 0, __s1[1] != 0)))) goto LAB_001037ef;
        }
      }
      local_4050.sa_data._2_4_ = iVar2;
      connect(__fd,&local_4050,0x10);
      puVar3 = (uint *)__errno_location();
      if ((*puVar3 & 0xfffffffe) != 0x72) goto LAB_00103897;
      local_4058.events = 0x1c;
      local_4058.revents = 0;
      local_4058.fd = __fd;
      ctx = co_get_epoll_ct();
      co_poll(ctx,&local_4058,1,200);
      local_4060 = 0;
      local_405c = 4;
      *puVar3 = 0;
      iVar1 = getsockopt(__fd,1,4,&local_4060,&local_405c);
      if (iVar1 != -1) {
        if (local_4060 == 0) goto LAB_00103897;
        *puVar3 = local_4060;
      }
    }
    else {
LAB_00103897:
      sVar4 = write(__fd,"sarlmol",8);
      if ((0 < (int)sVar4) && (sVar4 = read(__fd,local_4038,0x4000), 0 < (int)sVar4)) {
        AddSuccCnt();
        goto LAB_00103742;
      }
    }
    close(__fd);
    AddFailCnt();
    __fd = -1;
  } while( true );
}

Assistant:

static void *readwrite_routine( void *arg )
{

	co_enable_hook_sys();

	stEndPoint *endpoint = (stEndPoint *)arg;
	char str[8]="sarlmol";
	char buf[ 1024 * 16 ];
	int fd = -1;
	int ret = 0;
	for(;;)
	{
		if ( fd < 0 )
		{
			fd = socket(PF_INET, SOCK_STREAM, 0);
			struct sockaddr_in addr;
			SetAddr(endpoint->ip, endpoint->port, addr);
			ret = connect(fd,(struct sockaddr*)&addr,sizeof(addr));
						
			if ( errno == EALREADY || errno == EINPROGRESS )
			{       
				struct pollfd pf = { 0 };
				pf.fd = fd;
				pf.events = (POLLOUT|POLLERR|POLLHUP);
				co_poll( co_get_epoll_ct(),&pf,1,200);
				//check connect
				int error = 0;
				uint32_t socklen = sizeof(error);
				errno = 0;
				ret = getsockopt(fd, SOL_SOCKET, SO_ERROR,(void *)&error,  &socklen);
				if ( ret == -1 ) 
				{       
					//printf("getsockopt ERROR ret %d %d:%s\n", ret, errno, strerror(errno));
					close(fd);
					fd = -1;
					AddFailCnt();
					continue;
				}       
				if ( error ) 
				{       
					errno = error;
					//printf("connect ERROR ret %d %d:%s\n", error, errno, strerror(errno));
					close(fd);
					fd = -1;
					AddFailCnt();
					continue;
				}       
			} 
	  			
		}
		
		ret = write( fd,str, 8);
		if ( ret > 0 )
		{
			ret = read( fd,buf, sizeof(buf) );
			if ( ret <= 0 )
			{
				//printf("co %p read ret %d errno %d (%s)\n",
				//		co_self(), ret,errno,strerror(errno));
				close(fd);
				fd = -1;
				AddFailCnt();
			}
			else
			{
				//printf("echo %s fd %d\n", buf,fd);
				AddSuccCnt();
			}
		}
		else
		{
			//printf("co %p write ret %d errno %d (%s)\n",
			//		co_self(), ret,errno,strerror(errno));
			close(fd);
			fd = -1;
			AddFailCnt();
		}
	}
	return 0;
}